

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O3

void __thiscall
HSimplexNla::reportArray
          (HSimplexNla *this,string *message,HighsInt offset,HVector *vector,bool force)

{
  int iVar1;
  pointer pcVar2;
  ulong uVar3;
  string local_50;
  
  if ((this->report_ | force) == 1) {
    iVar1 = this->lp_->num_row_;
    if ((long)iVar1 < 0x1a) {
      printf("%s",(message->_M_dataplus)._M_p);
      if (0 < iVar1) {
        uVar3 = 0;
        do {
          if ((uVar3 != 0) && ((int)uVar3 + (int)((uVar3 & 0xffffffff) / 10) * -10 == 0)) {
            printf("\n                                 ");
          }
          printf("%11.4g ",
                 (vector->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3]);
          uVar3 = uVar3 + 1;
        } while ((long)iVar1 != uVar3);
      }
      putchar(10);
      return;
    }
    pcVar2 = (message->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + message->_M_string_length);
    reportArraySparse(this,&local_50,offset,vector,force);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void HSimplexNla::reportArray(const std::string message, const HighsInt offset,
                              const HVector* vector, const bool force) const {
  if (!report_ && !force) return;
  const HighsInt num_row = lp_->num_row_;
  if (num_row > kReportItemLimit) {
    reportArraySparse(message, offset, vector, force);
  } else {
    printf("%s", message.c_str());
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      if (iRow > 0 && iRow % 10 == 0)
        printf("\n                                 ");
      printf("%11.4g ", vector->array[iRow]);
    }
    printf("\n");
  }
}